

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::WriteMakeRule
          (cmLocalUnixMakefileGenerator3 *this,ostream *os,char *comment,string *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *commands,bool symbolic,bool in_help)

{
  cmMakefile *this_00;
  string *psVar1;
  string_view sep;
  size_type sVar2;
  cmLocalUnixMakefileGenerator3 *pcVar3;
  bool bVar4;
  long lVar5;
  ostream *poVar6;
  cmValue cVar7;
  string *path;
  string_view prefix;
  string tgt;
  string replace;
  char local_f1;
  ostream *local_f0;
  string local_e8;
  string local_c8;
  cmLocalUnixMakefileGenerator3 *local_a8;
  string local_a0;
  char *local_80;
  string *local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_68;
  string local_60;
  undefined8 local_40;
  char *pcStack_38;
  
  local_f0 = os;
  local_a8 = this;
  local_78 = target;
  local_70 = commands;
  local_68 = depends;
  if (target->_M_string_length == 0) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"No target for WriteMakeRule! called with comment: ","");
    if (comment != (char *)0x0) {
      std::__cxx11::string::append((char *)&local_a0);
    }
    cmSystemTools::Error(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == &local_a0.field_2) {
      return;
    }
  }
  else {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    if (comment != (char *)0x0) {
      strlen(comment);
      std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,(ulong)comment);
      lVar5 = std::__cxx11::string::find((char)&local_a0,10);
      if (lVar5 != -1) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(local_f0,"# ",2);
          std::__cxx11::string::substr((ulong)&local_c8,(ulong)&local_a0);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_f0,local_c8._M_dataplus._M_p,local_c8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          lVar5 = std::__cxx11::string::find((char)&local_a0,10);
        } while (lVar5 != -1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_f0,"# ",2);
      std::__cxx11::string::substr((ulong)&local_c8,(ulong)&local_a0);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_f0,local_c8._M_dataplus._M_p,local_c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar3 = local_a8;
    cmOutputConverter::MaybeRelativeToTopBinDir(&local_e8,(cmOutputConverter *)local_a8,local_78);
    cmGlobalUnixMakefileGenerator3::ConvertToMakefilePath
              (&local_c8,
               (cmGlobalUnixMakefileGenerator3 *)
               (pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator,
               &local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    sVar2 = local_c8._M_string_length;
    local_80 = "";
    if (local_c8._M_string_length == 1) {
      local_80 = " ";
    }
    if (symbolic) {
      this_00 = (local_a8->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"CMAKE_MAKE_SYMBOLIC_RULE","");
      cVar7 = cmMakefile::GetDefinition(this_00,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if (cVar7.Value != (string *)0x0) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_f0,local_c8._M_dataplus._M_p,local_c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_80,(ulong)(sVar2 == 1));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,((cVar7.Value)->_M_dataplus)._M_p,(cVar7.Value)->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      }
    }
    pcVar3 = local_a8;
    path = (local_68->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (local_68->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (path == psVar1) {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_f0,local_c8._M_dataplus._M_p,local_c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_80,(ulong)(sVar2 == 1));
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,":\n",2);
    }
    else {
      do {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_f0,local_c8._M_dataplus._M_p,local_c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_80,(ulong)(sVar2 == 1));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
        cmOutputConverter::MaybeRelativeToTopBinDir(&local_60,(cmOutputConverter *)pcVar3,path);
        cmGlobalUnixMakefileGenerator3::ConvertToMakefilePath
                  (&local_e8,
                   (cmGlobalUnixMakefileGenerator3 *)
                   (pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator,
                   &local_60);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_e8._M_dataplus._M_p,local_e8._M_string_length);
        local_f1 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_f1,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        path = path + 1;
      } while (path != psVar1);
    }
    if ((local_70->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (local_70->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      local_40 = 1;
      pcStack_38 = "\n";
      sep._M_str = "\n";
      sep._M_len = 1;
      prefix._M_str = "\t";
      prefix._M_len = 1;
      cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_e8,prefix,local_70,(string_view)(ZEXT816(0x88ec69) << 0x40),sep);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_f0,local_e8._M_dataplus._M_p,local_e8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((symbolic) &&
       (bVar4 = cmLocalGenerator::IsWatcomWMake((cmLocalGenerator *)local_a8), !bVar4)) {
      std::__ostream_insert<char,std::char_traits<char>>(local_f0,".PHONY : ",9);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_f0,local_c8._M_dataplus._M_p,local_c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_f0,"\n",1);
    if (in_help) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_a8->LocalHelp,local_78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == &local_a0.field_2) {
      return;
    }
  }
  operator_delete(local_a0._M_dataplus._M_p,
                  CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                           local_a0.field_2._M_local_buf[0]) + 1);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteMakeRule(
  std::ostream& os, const char* comment, const std::string& target,
  const std::vector<std::string>& depends,
  const std::vector<std::string>& commands, bool symbolic, bool in_help)
{
  // Make sure there is a target.
  if (target.empty()) {
    std::string err("No target for WriteMakeRule! called with comment: ");
    if (comment) {
      err += comment;
    }
    cmSystemTools::Error(err);
    return;
  }

  std::string replace;

  // Write the comment describing the rule in the makefile.
  if (comment) {
    replace = comment;
    std::string::size_type lpos = 0;
    std::string::size_type rpos;
    while ((rpos = replace.find('\n', lpos)) != std::string::npos) {
      os << "# " << replace.substr(lpos, rpos - lpos) << "\n";
      lpos = rpos + 1;
    }
    os << "# " << replace.substr(lpos) << "\n";
  }

  // Construct the left hand side of the rule.
  std::string tgt =
    this->ConvertToMakefilePath(this->MaybeRelativeToTopBinDir(target));

  const char* space = "";
  if (tgt.size() == 1) {
    // Add a space before the ":" to avoid drive letter confusion on
    // Windows.
    space = " ";
  }

  // Mark the rule as symbolic if requested.
  if (symbolic) {
    if (cmValue sym =
          this->Makefile->GetDefinition("CMAKE_MAKE_SYMBOLIC_RULE")) {
      os << tgt << space << ": " << *sym << "\n";
    }
  }

  // Write the rule.
  if (depends.empty()) {
    // No dependencies.  The commands will always run.
    os << tgt << space << ":\n";
  } else {
    // Split dependencies into multiple rule lines.  This allows for
    // very long dependency lists even on older make implementations.
    for (std::string const& depend : depends) {
      os << tgt << space << ": "
         << this->ConvertToMakefilePath(this->MaybeRelativeToTopBinDir(depend))
         << '\n';
    }
  }

  if (!commands.empty()) {
    // Write the list of commands.
    os << cmWrap("\t", commands, "", "\n") << "\n";
  }
  if (symbolic && !this->IsWatcomWMake()) {
    os << ".PHONY : " << tgt << "\n";
  }
  os << "\n";
  // Add the output to the local help if requested.
  if (in_help) {
    this->LocalHelp.push_back(target);
  }
}